

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateSwitchStringLookup(Lowerer *this,Instr *instr)

{
  Func *func_00;
  LabelInstr *targetLabel;
  anon_class_24_3_250bfd5f_for_fn fn;
  uint32 offset;
  uint uVar1;
  BranchInstr *pBVar2;
  MultiBranchInstr *pMVar3;
  BranchDictionaryWrapper *pBVar4;
  RegOpnd *dst;
  Opnd *this_00;
  RegOpnd *baseOpnd;
  IndirOpnd *src;
  IntConstOpnd *pIVar5;
  IntConstOpnd *lenBitMaskOpnd;
  LabelInstr *defaultLabelInstr;
  RegOpnd *strLengthOpnd;
  Func *func;
  BVUnitT<unsigned_int> local_24;
  uint local_20;
  BVUnit32 bvLength;
  charcount_t maxLength;
  charcount_t minLength;
  Instr *instr_local;
  Lowerer *this_local;
  
  bvLength.word = 0xffffffff;
  local_20 = 0;
  BVUnitT<unsigned_int>::BVUnitT(&local_24,0);
  pBVar2 = IR::Instr::AsBranchInstr(instr);
  pMVar3 = IR::BranchInstr::AsMultiBrInstr(pBVar2);
  pBVar4 = IR::MultiBranchInstr::GetBranchDictionary(pMVar3);
  fn.maxLength = &local_20;
  fn.minLength = &bvLength.word;
  fn.bvLength = &local_24;
  JsUtil::
  BaseDictionary<JITJavascriptString*,void*,Js::BranchDictionaryWrapper<JITJavascriptString*>::DictAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,Js::BranchDictionaryWrapper<JITJavascriptString*>::SimpleDictionaryEntryWithFixUp,JsUtil::NoResizeLock>
  ::Map<Lowerer::GenerateSwitchStringLookup(IR::Instr*)::__0>
            ((BaseDictionary<JITJavascriptString*,void*,Js::BranchDictionaryWrapper<JITJavascriptString*>::DictAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,Js::BranchDictionaryWrapper<JITJavascriptString*>::SimpleDictionaryEntryWithFixUp,JsUtil::NoResizeLock>
              *)pBVar4,fn);
  func_00 = instr->m_func;
  dst = IR::RegOpnd::New(TyUint32,func_00);
  this_00 = IR::Instr::GetSrc1(instr);
  baseOpnd = IR::Opnd::AsRegOpnd(this_00);
  offset = Js::JavascriptString::GetOffsetOfcharLength();
  src = IR::IndirOpnd::New(baseOpnd,offset,TyUint32,func_00,false);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,instr,true);
  pBVar2 = IR::Instr::AsBranchInstr(instr);
  pMVar3 = IR::BranchInstr::AsMultiBrInstr(pBVar2);
  pBVar4 = IR::MultiBranchInstr::GetBranchDictionary(pMVar3);
  targetLabel = (LabelInstr *)pBVar4->defaultTarget;
  if (bvLength.word == local_20) {
    pIVar5 = IR::IntConstOpnd::New((ulong)bvLength.word,TyUint32,func_00,false);
    InsertCompareBranch(this,&dst->super_Opnd,&pIVar5->super_Opnd,BrNeq_A,targetLabel,instr,false);
  }
  else if (local_20 < 0x20) {
    uVar1 = BVUnitT<unsigned_int>::GetWord(&local_24);
    pIVar5 = IR::IntConstOpnd::New((ulong)uVar1,TyUint32,func_00,false);
    InsertBitTestBranch(this,&pIVar5->super_Opnd,&dst->super_Opnd,false,targetLabel,instr);
    pIVar5 = IR::IntConstOpnd::New(0xffffffe0,TyUint32,func_00,false);
    InsertTestBranch(&dst->super_Opnd,&pIVar5->super_Opnd,BrNeq_A,targetLabel,instr);
  }
  LowerMultiBr(this,instr,HelperOp_SwitchStringLookUp);
  return;
}

Assistant:

void Lowerer::GenerateSwitchStringLookup(IR::Instr * instr)
{
    /* Collect information about string length in all the case*/
    charcount_t minLength = UINT_MAX;
    charcount_t maxLength = 0;
    BVUnit32 bvLength;
    instr->AsBranchInstr()->AsMultiBrInstr()->GetBranchDictionary()->dictionary.Map([&](JITJavascriptString * str, void *)
    {
        charcount_t len = str->GetLength();
        minLength = min(minLength, str->GetLength());
        maxLength = max(maxLength, str->GetLength());
        if (len < 32)
        {
            bvLength.Set(len);
        }
    });

    Func * func = instr->m_func;
    IR::RegOpnd * strLengthOpnd = IR::RegOpnd::New(TyUint32, func);
    InsertMove(strLengthOpnd, IR::IndirOpnd::New(instr->GetSrc1()->AsRegOpnd(), Js::JavascriptString::GetOffsetOfcharLength(), TyUint32, func), instr);
    IR::LabelInstr * defaultLabelInstr = (IR::LabelInstr *)instr->AsBranchInstr()->AsMultiBrInstr()->GetBranchDictionary()->defaultTarget;
    if (minLength == maxLength)
    {
        // Generate single length filter
        InsertCompareBranch(strLengthOpnd, IR::IntConstOpnd::New(minLength, TyUint32, func), Js::OpCode::BrNeq_A, defaultLabelInstr, instr);
    }
    else if (maxLength < 32)
    {
        // Generate bit filter

        // Jump to default label if the bit is not on for the length % 32
        IR::IntConstOpnd * lenBitMaskOpnd = IR::IntConstOpnd::New(bvLength.GetWord(), TyUint32, func);
        InsertBitTestBranch(lenBitMaskOpnd, strLengthOpnd, false, defaultLabelInstr, instr);
        // Jump to default label if the bit is > 32
        InsertTestBranch(strLengthOpnd, IR::IntConstOpnd::New(UINT32_MAX ^ 31, TyUint32, func), Js::OpCode::BrNeq_A, defaultLabelInstr, instr);
    }
    else
    {
        // CONSIDER: Generate range filter
    }
    this->LowerMultiBr(instr, IR::HelperOp_SwitchStringLookUp);
}